

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

bool __thiscall
helics::apps::AsioBrokerServer::udpDataReceive
          (AsioBrokerServer *this,shared_ptr<helics::udp::UdpServer> *server,char *data,
          size_t bytes_received)

{
  UdpServer *this_00;
  bool bVar1;
  string_view message;
  string local_1c0;
  ActionMessage rep;
  ActionMessage m;
  
  ActionMessage::ActionMessage(&m,data,(long)(int)bytes_received);
  if (((m.messageAction == cmd_protocol_priority) || (m.messageAction == cmd_protocol_big)) ||
     (m.messageAction == cmd_protocol)) {
    TypedBrokerServer::generateMessageResponse(&rep,&m,&this->udpPortData,UDP);
    if (rep.messageAction != cmd_ignore) {
      this_00 = (server->super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      ActionMessage::to_string_abi_cxx11_(&local_1c0,&rep);
      message._M_str = local_1c0._M_dataplus._M_p;
      message._M_len = local_1c0._M_string_length;
      udp::UdpServer::reply(this_00,message);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    ActionMessage::~ActionMessage(&rep);
  }
  else if (bytes_received == 5) {
    rep._0_8_ = &rep.dest_id;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rep,data,data + 5);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &rep,"close");
    std::__cxx11::string::~string((string *)&rep);
    if (bVar1) {
      bVar1 = false;
      goto LAB_00198a67;
    }
  }
  bVar1 = true;
LAB_00198a67:
  ActionMessage::~ActionMessage(&m);
  return bVar1;
}

Assistant:

bool AsioBrokerServer::udpDataReceive(const std::shared_ptr<udp::UdpServer>& server,
                                          const char* data,
                                          size_t bytes_received)
    {
        ActionMessage m(data, static_cast<int>(bytes_received));
        if (isProtocolCommand(m)) {
            // if the reply is not ignored respond with it otherwise
            // forward the original message on to the receiver to handle
            auto rep = generateMessageResponse(m, udpPortData, CoreType::UDP);
            if (rep.action() != CMD_IGNORE) {
                try {
                    server->reply(rep.to_string());
                }
                catch (const std::system_error&) {
                    return false;
                }
            }
        } else if (bytes_received == 5) {
            if (std::string(data, bytes_received) == "close") {
                return false;
            }
        }

        return true;
    }